

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O0

int __thiscall Polynomial::createMaxMinNode(Polynomial *this,int first_loc,int second_loc,char op)

{
  int iVar1;
  initializer_list<int> __l;
  size_type sVar2;
  value_type_conflict2 local_8c;
  value_type local_88;
  operandType local_68;
  operandType maxmin;
  allocator<int> local_51;
  int local_50;
  int local_4c;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<int,_std::allocator<int>_> args;
  char op_local;
  int second_loc_local;
  int first_loc_local;
  Polynomial *this_local;
  
  args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = op;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->mEvaluationValues);
  this->mResultLocation = (int)sVar2;
  local_48 = &local_50;
  local_40 = 2;
  local_50 = first_loc;
  local_4c = second_loc;
  std::allocator<int>::allocator(&local_51);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_38,__l,&local_51);
  std::allocator<int>::~allocator(&local_51);
  local_88.op = args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._7_1_ == '<' | MAX;
  local_68 = local_88.op;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_88.args,(vector<int,_std::allocator<int>_> *)local_38);
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::push_back
            (&this->mOperands,&local_88);
  operand::~operand(&local_88);
  local_8c = 0;
  std::vector<int,_std::allocator<int>_>::push_back(&this->mEvaluationValues,&local_8c);
  iVar1 = this->mResultLocation;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_38);
  return iVar1;
}

Assistant:

int Polynomial::createMaxMinNode(int first_loc, int second_loc, char op)
{
  mResultLocation = mEvaluationValues.size();
  std::vector<int> args { first_loc, second_loc};
  operandType maxmin = (op == MIN_OPERATOR ? operandType::MIN : operandType::MAX);
  mOperands.push_back({maxmin, args});
  mEvaluationValues.push_back(0); // make space in evaluation array for the output.
  return mResultLocation;
}